

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O0

void __thiscall
snappy::SnappyDecompressor::DecompressAllTags<snappy::SnappyArrayWriter>
          (SnappyDecompressor *this,SnappyArrayWriter *writer)

{
  ushort uVar1;
  bool bVar2;
  uint32 uVar3;
  int iVar4;
  undefined4 extraout_var;
  byte *ip_00;
  uint32 copy_offset;
  uint32 length;
  uint32 trailer;
  uint32 entry;
  size_t n;
  size_t avail;
  size_t literal_length_length;
  size_t literal_length;
  byte *pbStack_20;
  uchar c;
  char *ip;
  SnappyArrayWriter *writer_local;
  SnappyDecompressor *this_local;
  
  pbStack_20 = (byte *)this->ip_;
  ip = (char *)writer;
  writer_local = (SnappyArrayWriter *)this;
  if ((long)this->ip_limit_ - (long)pbStack_20 < 5) {
    this->ip_ = (char *)pbStack_20;
    bVar2 = RefillTag(this);
    if (!bVar2) {
      return;
    }
    pbStack_20 = (byte *)this->ip_;
  }
  do {
    while( true ) {
      while( true ) {
        ip_00 = pbStack_20 + 1;
        literal_length._7_1_ = *pbStack_20;
        pbStack_20 = ip_00;
        if ((literal_length._7_1_ & 3) == 0) break;
        uVar1 = *(ushort *)(char_table + (ulong)literal_length._7_1_ * 2);
        uVar3 = LittleEndian::Load32(ip_00);
        pbStack_20 = pbStack_20 + (uVar1 >> 0xb);
        bVar2 = SnappyArrayWriter::AppendFromSelf
                          ((SnappyArrayWriter *)ip,
                           (ulong)((uVar1 & 0x700) +
                                  (uVar3 & *(uint *)(wordmask + (ulong)(uVar1 >> 0xb) * 4))),
                           (ulong)(uVar1 & 0xff));
        if (!bVar2) {
          return;
        }
        if ((long)this->ip_limit_ - (long)pbStack_20 < 5) {
          this->ip_ = (char *)pbStack_20;
          bVar2 = RefillTag(this);
          if (!bVar2) {
            return;
          }
          pbStack_20 = (byte *)this->ip_;
        }
      }
      literal_length_length = (size_t)(((int)(uint)literal_length._7_1_ >> 2) + 1);
      bVar2 = SnappyArrayWriter::TryFastAppend
                        ((SnappyArrayWriter *)ip,(char *)ip_00,(long)this->ip_limit_ - (long)ip_00,
                         literal_length_length);
      if (!bVar2) break;
      if (0x3c < literal_length_length) {
        __assert_fail("literal_length < 61",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/snappy/snappy.cc"
                      ,0x2e6,
                      "void snappy::SnappyDecompressor::DecompressAllTags(Writer *) [Writer = snappy::SnappyArrayWriter]"
                     );
      }
      pbStack_20 = pbStack_20 + literal_length_length;
    }
    if (0x3c < literal_length_length) {
      avail = literal_length_length - 0x3c;
      uVar3 = LittleEndian::Load32(pbStack_20);
      literal_length_length = (size_t)((uVar3 & *(uint *)(wordmask + avail * 4)) + 1);
      pbStack_20 = pbStack_20 + avail;
    }
    n = (long)this->ip_limit_ - (long)pbStack_20;
    while (n < literal_length_length) {
      bVar2 = SnappyArrayWriter::Append((SnappyArrayWriter *)ip,(char *)pbStack_20,n);
      if (!bVar2) {
        return;
      }
      literal_length_length = literal_length_length - n;
      (*this->reader_->_vptr_Source[4])(this->reader_,(ulong)this->peeked_);
      iVar4 = (*this->reader_->_vptr_Source[3])(this->reader_,&trailer);
      pbStack_20 = (byte *)CONCAT44(extraout_var,iVar4);
      n = _trailer;
      this->peeked_ = (uint32)_trailer;
      if (_trailer == 0) {
        return;
      }
      this->ip_limit_ = (char *)(pbStack_20 + _trailer);
    }
    bVar2 = SnappyArrayWriter::Append
                      ((SnappyArrayWriter *)ip,(char *)pbStack_20,literal_length_length);
    if (!bVar2) {
      return;
    }
    pbStack_20 = pbStack_20 + literal_length_length;
    if ((long)this->ip_limit_ - (long)pbStack_20 < 5) {
      this->ip_ = (char *)pbStack_20;
      bVar2 = RefillTag(this);
      if (!bVar2) {
        return;
      }
      pbStack_20 = (byte *)this->ip_;
    }
  } while( true );
}

Assistant:

void DecompressAllTags(Writer* writer) {
    const char* ip = ip_;

    // We could have put this refill fragment only at the beginning of the loop.
    // However, duplicating it at the end of each branch gives the compiler more
    // scope to optimize the <ip_limit_ - ip> expression based on the local
    // context, which overall increases speed.
    #define MAYBE_REFILL() \
        if (ip_limit_ - ip < kMaximumTagLength) { \
          ip_ = ip; \
          if (!RefillTag()) return; \
          ip = ip_; \
        }

    MAYBE_REFILL();
    for ( ;; ) {
      const unsigned char c = *(reinterpret_cast<const unsigned char*>(ip++));

      if ((c & 0x3) == LITERAL) {
        size_t literal_length = (c >> 2) + 1u;
        if (writer->TryFastAppend(ip, ip_limit_ - ip, literal_length)) {
          assert(literal_length < 61);
          ip += literal_length;
          // NOTE(user): There is no MAYBE_REFILL() here, as TryFastAppend()
          // will not return true unless there's already at least five spare
          // bytes in addition to the literal.
          continue;
        }
        if (PREDICT_FALSE(literal_length >= 61)) {
          // Long literal.
          const size_t literal_length_length = literal_length - 60;
          literal_length =
              (LittleEndian::Load32(ip) & wordmask[literal_length_length]) + 1;
          ip += literal_length_length;
        }

        size_t avail = ip_limit_ - ip;
        while (avail < literal_length) {
          if (!writer->Append(ip, avail)) return;
          literal_length -= avail;
          reader_->Skip(peeked_);
          size_t n;
          ip = reader_->Peek(&n);
          avail = n;
          peeked_ = avail;
          if (avail == 0) return;  // Premature end of input
          ip_limit_ = ip + avail;
        }
        if (!writer->Append(ip, literal_length)) {
          return;
        }
        ip += literal_length;
        MAYBE_REFILL();
      } else {
        const uint32 entry = char_table[c];
        const uint32 trailer = LittleEndian::Load32(ip) & wordmask[entry >> 11];
        const uint32 length = entry & 0xff;
        ip += entry >> 11;

        // copy_offset/256 is encoded in bits 8..10.  By just fetching
        // those bits, we get copy_offset (since the bit-field starts at
        // bit 8).
        const uint32 copy_offset = entry & 0x700;
        if (!writer->AppendFromSelf(copy_offset + trailer, length)) {
          return;
        }
        MAYBE_REFILL();
      }
    }

#undef MAYBE_REFILL
  }